

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

void __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::
MapAllocator<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::Node>
::deallocate(MapAllocator<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::Node>
             *this,pointer p,size_type n)

{
  void *in_RSI;
  long *in_RDI;
  
  if (*in_RDI == 0) {
    operator_delete(in_RSI);
  }
  return;
}

Assistant:

void deallocate(pointer p, size_type n) {
      if (arena_ == NULL) {
#if defined(__GXX_DELETE_WITH_SIZE__) || defined(__cpp_sized_deallocation)
        ::operator delete(p, n * sizeof(value_type));
#else
        (void)n;
        ::operator delete(p);
#endif
      }
    }